

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  VarStatus VVar1;
  type_conflict5 tVar2;
  bool bVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  VarStatus *pVVar6;
  char *pcVar7;
  int __c;
  int __c_00;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_stack_00000008;
  byte in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff578;
  cpp_dec_float<200U,_int,_void> *v;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff580;
  double in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff590;
  int in_stack_fffffffffffff594;
  uint uVar8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff598;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5a0;
  undefined8 local_a30;
  undefined1 local_a28 [128];
  undefined1 local_9a8 [32];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff678;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff680;
  double in_stack_fffffffffffff690;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff698;
  undefined1 local_928 [128];
  undefined8 local_8a8;
  undefined1 local_8a0 [48];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff790;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff798;
  undefined1 local_820 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_720;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a0;
  undefined8 local_620;
  undefined8 local_618;
  undefined1 local_60c [128];
  undefined1 local_58c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_50c;
  undefined1 local_48c [128];
  uint local_40c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  undefined8 local_388;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_37c;
  byte local_2f9;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_2f8;
  cpp_dec_float<200U,_int,_void> *local_2d8;
  undefined8 local_2c8;
  undefined8 *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  long *local_2b0;
  undefined1 *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined1 *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  undefined1 *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  cpp_dec_float<200U,_int,_void> *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_240;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  undefined8 *local_210;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_201;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  undefined1 *local_1d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1c1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined1 *local_190;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_181;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_141;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_2f9 = in_stack_00000010 & 1;
  local_2f8 = in_R9;
  local_2d8 = in_RSI;
  if (*(int *)((long)in_RDI + 0x2c) != *(int *)((long)in_RDI + 0x34)) {
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff580,
                          (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_218 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff580,
                             (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_220 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff580,
                          (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_228 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff580,
                             (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_230 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    VVar1 = *pVVar6;
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,*(int *)((long)in_RDI + 0x34));
    *pVVar6 = VVar1;
  }
  if ((int)in_RDI[5] != (int)in_RDI[6]) {
    in_stack_fffffffffffff598 =
         (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff580,
                         (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_238 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff580,
                             (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_240 = in_stack_fffffffffffff598;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    in_stack_fffffffffffff5a0 =
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_248 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff580,
                             (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
    local_250 = in_stack_fffffffffffff5a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_2f8,(int)in_RDI[5]);
    VVar1 = *pVVar6;
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_2f8,(int)in_RDI[6]);
    *pVVar6 = VVar1;
  }
  local_388 = 0;
  local_2b8 = &local_37c;
  local_2c0 = &local_388;
  local_2c8 = 0;
  local_210 = local_2c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),in_stack_fffffffffffff588
             ,in_stack_fffffffffffff580);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](in_stack_fffffffffffff598,in_stack_fffffffffffff594);
  local_40c = 0;
  while (uVar8 = local_40c,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI + 0x29)), (int)uVar8 < iVar4) {
    pcVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x29),(char *)(ulong)local_40c,__c);
    if ((int)pcVar7 != (int)in_RDI[5]) {
      pnVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI + 0x29),local_40c);
      in_stack_fffffffffffff580 = local_2d8;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(in_RDI + 0x29),(char *)(ulong)local_40c,__c_00);
      local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff580,
                              (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
      local_b0 = local_48c;
      local_b8 = pnVar5;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_c1,pnVar5,local_c0);
      local_a8 = local_48c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff580);
      local_90 = local_48c;
      local_98 = local_b8;
      local_a0 = local_c0;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                 (cpp_dec_float<200U,_int,_void> *)0x73b314);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=(in_stack_fffffffffffff5a0,(self_type *)in_stack_fffffffffffff598);
    }
    local_40c = local_40c + 1;
  }
  local_2b0 = in_RDI + 0x17;
  local_2a8 = local_58c;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  local_298 = local_60c;
  local_2a0 = &local_37c;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (in_stack_fffffffffffff798,in_stack_fffffffffffff790);
  local_618 = 0x3ff0000000000000;
  tVar2 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff578,(double *)0x73b3f1);
  if (tVar2) {
    local_620 = 0x3ff0000000000000;
    local_50 = &local_50c;
    local_58 = &local_620;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  }
  local_138 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(in_RDI + 0x17);
  local_130 = &local_720;
  local_140 = &local_50c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_141,local_138,local_140);
  local_128 = &local_720;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_110 = &local_720;
  local_118 = local_138;
  local_120 = local_140;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (cpp_dec_float<200U,_int,_void> *)0x73b50b);
  local_170 = &local_7a0;
  local_178 = &local_37c;
  local_180 = &local_50c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_181,local_178,local_180);
  local_168 = &local_7a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_150 = &local_7a0;
  local_158 = local_178;
  local_160 = local_180;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (cpp_dec_float<200U,_int,_void> *)0x73b5c2);
  local_28 = &local_6a0;
  local_30 = &local_720;
  local_38 = &local_7a0;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = &local_6a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_8 = &local_6a0;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (cpp_dec_float<200U,_int,_void> *)0x73b679);
  local_288 = local_820;
  local_290 = &local_6a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*in_RDI + 0x38))(local_8a0);
  bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  if (bVar3) {
    local_8a8 = 0;
    local_68 = &local_6a0;
    local_70 = &local_8a8;
    local_60 = local_70;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  }
  local_f0 = local_9a8;
  local_f8 = &local_6a0;
  local_100 = &local_50c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_101,local_f8,local_100);
  local_e8 = local_9a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_d0 = local_9a8;
  local_d8 = local_f8;
  local_e0 = local_100;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (cpp_dec_float<200U,_int,_void> *)0x73b7e8);
  local_1b0 = local_928;
  local_1b8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_9a8;
  local_1c0 = &local_408;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_1c1,local_1b8,local_1c0);
  local_1a8 = local_928;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_190 = local_928;
  local_198 = local_1b8;
  local_1a0 = local_1c0;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (cpp_dec_float<200U,_int,_void> *)0x73b89f);
  local_268 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff580,
                           (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
  local_270 = local_928;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  v = (cpp_dec_float<200U,_int,_void> *)(in_RDI + 0x17);
  local_258 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff580,(int)((ulong)v >> 0x20));
  local_260 = v;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff580,v);
  local_1f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(in_RDI + 7);
  local_1f0 = local_a28;
  local_200 = &local_408;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_201,local_1f8,local_200);
  local_1e8 = local_a28;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff580);
  local_1d0 = local_a28;
  local_1d8 = local_1f8;
  local_1e0 = local_200;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff580,v,(cpp_dec_float<200U,_int,_void> *)0x73b9df);
  local_278 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff580,(int)((ulong)v >> 0x20));
  local_280 = local_a28;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff580,v);
  local_a30 = 0;
  local_80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff580,(int)((ulong)v >> 0x20));
  local_88 = &local_a30;
  local_78 = local_88;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](local_2f8,(int)in_RDI[5]);
  *pVVar6 = BASIC;
  if ((*(byte *)((long)in_RDI + 0x139) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x27) & 1) == 0) {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
      *pVVar6 = ON_UPPER;
    }
    else {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
      *pVVar6 = ON_LOWER;
    }
  }
  else {
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    *pVVar6 = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}